

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeTexParameterCase::iterate
          (NegativeTexParameterCase *this)

{
  ostringstream *poVar1;
  TestLog *log;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  GLenum GVar4;
  GLenum GVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  ulong uVar7;
  GLint param;
  allocator<char> local_231;
  CallLogWrapper gl;
  ScopedLogSection scope;
  Texture texture;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  MessageBuilder local_1a8;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"Iteration",&local_231);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_1c8,&local_1e8,"Testing parameter with ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texture,
                 &local_1c8,iterate::types[this->m_iteration].name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texture,
                 " texture");
  tcu::ScopedLogSection::ScopedLogSection(&scope,log,(string *)&local_1a8,(string *)&gl);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::string::~string((string *)&texture);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1a8);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2 && iterate::types[this->m_iteration].isArrayType == true) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_OES_texture_storage_multisample_2d_array");
    if (!bVar2) {
      local_1a8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1a8.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,
                      "GL_OES_texture_storage_multisample_2d_array not supported, skipping target");
      tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      goto LAB_004d52e6;
    }
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&texture,((this->super_TestCase).m_context)->m_renderCtx);
  gl.m_enableLog = true;
  glu::CallLogWrapper::glBindTexture
            (&gl,iterate::types[this->m_iteration].target,texture.super_ObjectWrapper.m_object);
  iVar3 = this->m_iteration;
  if (iterate::types[iVar3].isArrayType == true) {
    glu::CallLogWrapper::glTexStorage3DMultisample
              (&gl,iterate::types[iVar3].target,1,iterate::types[iVar3].internalFormat,0x10,0x10,
               0x10,'\0');
  }
  else {
    glu::CallLogWrapper::glTexStorage2DMultisample
              (&gl,iterate::types[iVar3].target,1,iterate::types[iVar3].internalFormat,0x10,0x10,
               '\0');
  }
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar4,"setup texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x767);
  uVar7 = (ulong)this->m_texParam;
  GVar4 = 0;
  param = 0;
  if (uVar7 < 10) {
    GVar4 = *(GLenum *)(&DAT_00827558 + uVar7 * 4);
    param = *(GLint *)(&DAT_00827580 + uVar7 * 4);
  }
  glu::CallLogWrapper::glTexParameteri(&gl,iterate::types[this->m_iteration].target,GVar4,param);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  GVar4 = 0;
  if ((ulong)this->m_texParam < 10) {
    GVar4 = *(GLenum *)(&DAT_008275a8 + (ulong)this->m_texParam * 4);
  }
  if (GVar5 != GVar4) {
    local_1a8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1a8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Got unexpected error: ");
    local_1c8._M_dataplus._M_p = (pointer)glu::getErrorName;
    local_1c8._M_string_length._0_4_ = GVar5;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1c8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", expected: ");
    uVar6 = 0;
    if ((ulong)this->m_texParam < 10) {
      uVar6 = *(undefined4 *)(&DAT_008275a8 + (ulong)this->m_texParam * 4);
    }
    local_1e8._M_dataplus._M_p = (pointer)glu::getErrorName;
    local_1e8._M_string_length = CONCAT44(local_1e8._M_string_length._4_4_,uVar6);
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1e8,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got wrong error code");
  }
  glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
LAB_004d52e6:
  iVar3 = this->m_iteration + 1;
  this->m_iteration = iVar3;
  tcu::ScopedLogSection::~ScopedLogSection(&scope);
  return (IterateResult)(iVar3 < 6);
}

Assistant:

NegativeTexParameterCase::IterateResult NegativeTexParameterCase::iterate (void)
{
	static const struct TextureType
	{
		const char*	name;
		glw::GLenum	target;
		glw::GLenum	internalFormat;
		bool		isArrayType;
	} types[] =
	{
		{ "color",					GL_TEXTURE_2D_MULTISAMPLE,			GL_RGBA8,	false	},
		{ "color array",			GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_RGBA8,	true	},
		{ "signed integer",			GL_TEXTURE_2D_MULTISAMPLE,			GL_R8I,		false	},
		{ "signed integer array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_R8I,		true	},
		{ "unsigned integer",		GL_TEXTURE_2D_MULTISAMPLE,			GL_R8UI,	false	},
		{ "unsigned integer array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_R8UI,	true	},
	};

	const tcu::ScopedLogSection scope(m_testCtx.getLog(), "Iteration", std::string() + "Testing parameter with " + types[m_iteration].name + " texture");
	const bool					supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (types[m_iteration].isArrayType && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_OES_texture_storage_multisample_2d_array not supported, skipping target" << tcu::TestLog::EndMessage;
	else
	{
		glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
		glu::Texture			texture	(m_context.getRenderContext());
		glw::GLenum				error;

		gl.enableLogging(true);

		// gen texture

		gl.glBindTexture(types[m_iteration].target, *texture);

		if (types[m_iteration].isArrayType)
			gl.glTexStorage3DMultisample(types[m_iteration].target, 1, types[m_iteration].internalFormat, 16, 16, 16, GL_FALSE);
		else
			gl.glTexStorage2DMultisample(types[m_iteration].target, 1, types[m_iteration].internalFormat, 16, 16, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup texture");

		// set param

		gl.glTexParameteri(types[m_iteration].target, getParamGLEnum(), getParamValue());
		error = gl.glGetError();

		// expect failure

		if (error != getExpectedError())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Got unexpected error: " << glu::getErrorStr(error) << ", expected: " << glu::getErrorStr(getExpectedError()) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong error code");
		}
	}

	if (++m_iteration < DE_LENGTH_OF_ARRAY(types))
		return CONTINUE;
	return STOP;
}